

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void * multi_thread_kvs_client(void *args)

{
  fdb_kvs_handle *pfVar1;
  fdb_file_handle *pfVar2;
  fdb_custom_cmp_variable __th;
  fdb_doc *doc;
  size_t *psVar3;
  size_t keylen;
  fdb_status fVar4;
  int iVar5;
  fdb_config *pfVar6;
  size_t sVar7;
  fdb_kvs_handle *pfVar8;
  uint8_t *puVar9;
  fdb_doc *pfVar10;
  size_t sVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar12;
  fdb_kvs_config *in_RCX;
  double *extraout_RDX;
  fdb_kvs_config *__arg;
  ulong uVar13;
  long lVar14;
  char **ptr_handle;
  void **ppvVar15;
  fdb_config *pfVar16;
  uint uVar17;
  uint64_t *puVar18;
  uint64_t *puVar19;
  uint64_t *puVar20;
  uint64_t *puVar21;
  uint64_t *puVar22;
  uint64_t *puVar23;
  uint64_t *puVar24;
  char *pcVar25;
  code *__src;
  fdb_config *unaff_R12;
  code *unaff_R13;
  fdb_config *pfVar26;
  fdb_config *unaff_R15;
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  undefined1 auStackY_1159 [1424];
  undefined1 auStackY_bc9 [376];
  undefined1 auStackY_a51 [233];
  fdb_config local_958;
  undefined8 uStack_830;
  void *apvStack_818 [51];
  undefined1 local_680 [8];
  fdb_config fconfig;
  char metabuf [256];
  undefined1 local_438 [8];
  char bodybuf [256];
  undefined1 local_298 [8];
  char dbstr [256];
  char keybuf [256];
  timeval __test_begin;
  fdb_kvs_handle *tdb;
  fdb_custom_cmp_variable local_78;
  undefined1 auStack_68 [8];
  fdb_kvs_config kvs_config;
  fdb_seqnum_t seqnum;
  fdb_kvs_handle *local_40;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  
  puVar18 = (uint64_t *)&stack0xfffffffffffffff8;
  puVar19 = (uint64_t *)&stack0xfffffffffffffff8;
  puVar20 = (uint64_t *)&stack0xfffffffffffffff8;
  puVar21 = (uint64_t *)&stack0xfffffffffffffff8;
  puVar22 = (uint64_t *)&stack0xfffffffffffffff8;
  puVar23 = (uint64_t *)&stack0xfffffffffffffff8;
  puVar24 = (uint64_t *)&stack0xfffffffffffffff8;
  ppvVar15 = apvStack_818;
  pfVar16 = (fdb_config *)apvStack_818;
  gettimeofday((timeval *)(keybuf + 0xf8),(__timezone_ptr_t)0x0);
  dbfile = (fdb_file_handle *)0x0;
  if (args != (void *)0x0) {
    pfVar6 = (fdb_config *)local_298;
    fdb_get_default_config();
    unaff_R15 = (fdb_config *)local_680;
    memcpy(unaff_R15,pfVar6,0xf8);
    pfVar8 = (fdb_kvs_handle *)&local_40;
    fVar4 = fdb_open((fdb_file_handle **)pfVar8,"./dummy1",unaff_R15);
    pfVar26 = (fdb_config *)apvStack_818;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114281;
    uVar17 = *args;
    args = local_298;
    sprintf((char *)args,"db%d",(ulong)uVar17);
    pfVar6 = (fdb_config *)(dbstr + 0xf8);
    fdb_get_default_kvs_config();
    in_RCX = (fdb_kvs_config *)auStack_68;
    kvs_config.custom_cmp = (fdb_custom_cmp_variable)keybuf._8_8_;
    auStack_68[0] = dbstr[0xf8];
    auStack_68[1] = dbstr[0xf9];
    auStack_68[2] = dbstr[0xfa];
    auStack_68[3] = dbstr[0xfb];
    auStack_68[4] = dbstr[0xfc];
    auStack_68[5] = dbstr[0xfd];
    auStack_68[6] = dbstr[0xfe];
    auStack_68[7] = dbstr[0xff];
    kvs_config.create_if_missing = (bool)keybuf[0];
    kvs_config._1_1_ = keybuf[1];
    kvs_config._2_1_ = keybuf[2];
    kvs_config._3_1_ = keybuf[3];
    kvs_config._4_1_ = keybuf[4];
    kvs_config._5_1_ = keybuf[5];
    kvs_config._6_1_ = keybuf[6];
    kvs_config._7_1_ = keybuf[7];
    pfVar8 = local_40;
    fVar4 = fdb_kvs_open((fdb_file_handle *)local_40,(fdb_kvs_handle **)&__test_begin.tv_usec,
                         (char *)args,in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114286;
    args = (fdb_kvs_config *)0x0;
    unaff_R15 = (fdb_config *)0x0;
    do {
      sprintf(dbstr + 0xf8,"key%d",(ulong)unaff_R15 & 0xffffffff);
      sprintf((char *)&fconfig.num_blocks_readahead,"meta%d",(ulong)unaff_R15 & 0xffffffff);
      sprintf(local_438,"body%d",(ulong)unaff_R15 & 0xffffffff);
      unaff_R13 = (code *)((long)apvStack_818 + (long)args);
      pfVar6 = (fdb_config *)strlen(dbstr + 0xf8);
      unaff_R12 = (fdb_config *)strlen((char *)&fconfig.num_blocks_readahead);
      sVar7 = strlen(local_438);
      in_RCX = (fdb_kvs_config *)&fconfig.num_blocks_readahead;
      uStack_830 = 0x113e39;
      fdb_doc_create((fdb_doc **)unaff_R13,dbstr + 0xf8,(size_t)pfVar6,in_RCX,(size_t)unaff_R12,
                     local_438,sVar7);
      pfVar8 = (fdb_kvs_handle *)__test_begin.tv_usec;
      fVar4 = fdb_set((fdb_kvs_handle *)__test_begin.tv_usec,
                      (fdb_doc *)apvStack_818[(long)unaff_R15]);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114263;
      fdb_doc_free((fdb_doc *)apvStack_818[(long)unaff_R15]);
      unaff_R15 = (fdb_config *)((long)&unaff_R15->chunksize + 1);
      args = &((fdb_kvs_config *)args)->custom_cmp;
    } while (unaff_R15 != (fdb_config *)0x32);
    pfVar8 = local_40;
    fVar4 = fdb_commit((fdb_file_handle *)local_40,'\x01');
    pfVar16 = (fdb_config *)apvStack_818;
    if (fVar4 == FDB_RESULT_SUCCESS) {
      fdb_close((fdb_file_handle *)local_40);
      return (void *)0x0;
    }
    goto LAB_00114290;
  }
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  args = local_298;
  fdb_get_default_config();
  pfVar6 = (fdb_config *)local_680;
  memcpy(pfVar6,args,0xf8);
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.flags._3_1_ = 0;
  pfVar8 = (fdb_kvs_handle *)&local_40;
  fVar4 = fdb_open((fdb_file_handle **)pfVar8,"./dummy1",pfVar6);
  pfVar16 = (fdb_config *)apvStack_818;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011428b;
  pfVar6 = (fdb_config *)(local_958.encryption_key.bytes + 0xc);
  pfVar16 = &local_958;
  pfVar26 = (fdb_config *)local_298;
  args = auStack_68;
  unaff_R15 = (fdb_config *)0x0;
  unaff_R13 = (code *)0x0;
  do {
    sprintf((char *)pfVar26,"db%d",(ulong)unaff_R13 & 0xffffffff);
    fdb_get_default_kvs_config();
    kvs_config.custom_cmp = (fdb_custom_cmp_variable)keybuf._8_8_;
    auStack_68[0] = dbstr[0xf8];
    auStack_68[1] = dbstr[0xf9];
    auStack_68[2] = dbstr[0xfa];
    auStack_68[3] = dbstr[0xfb];
    auStack_68[4] = dbstr[0xfc];
    auStack_68[5] = dbstr[0xfd];
    auStack_68[6] = dbstr[0xfe];
    auStack_68[7] = dbstr[0xff];
    kvs_config.create_if_missing = (bool)keybuf[0];
    kvs_config._1_1_ = keybuf[1];
    kvs_config._2_1_ = keybuf[2];
    kvs_config._3_1_ = keybuf[3];
    kvs_config._4_1_ = keybuf[4];
    kvs_config._5_1_ = keybuf[5];
    kvs_config._6_1_ = keybuf[6];
    kvs_config._7_1_ = keybuf[7];
    in_RCX = (fdb_kvs_config *)args;
    pfVar8 = local_40;
    fVar4 = fdb_kvs_open((fdb_file_handle *)local_40,
                         (fdb_kvs_handle **)(bodybuf + 0xf8 + (long)unaff_R15),(char *)pfVar26,
                         (fdb_kvs_config *)args);
    unaff_R12 = pfVar16;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011426d;
    pfVar8 = *(fdb_kvs_handle **)(bodybuf + (long)unaff_R13 * 8 + 0xf8);
    fVar4 = fdb_kvs_close(pfVar8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114268;
    unaff_R13 = (code *)((bool *)unaff_R13 + 1);
    unaff_R15 = (fdb_config *)&unaff_R15->buffercache_size;
  } while (unaff_R13 != (code *)0x14);
  __arg = (fdb_kvs_config *)(metabuf + 0xf8);
  lVar14 = 0;
  unaff_R15 = pfVar6;
  do {
    *(int *)__arg = (int)lVar14;
    in_RCX = __arg;
    pthread_create((pthread_t *)unaff_R15,(pthread_attr_t *)0x0,multi_thread_kvs_client,__arg);
    lVar14 = lVar14 + 1;
    unaff_R15 = (fdb_config *)&unaff_R15->buffercache_size;
    __arg = (fdb_kvs_config *)&__arg->field_0x4;
  } while (lVar14 != 0x14);
  lVar14 = 0;
  do {
    pthread_join(*(pthread_t *)((long)&pfVar6->chunksize + lVar14),
                 (void **)((long)&pfVar16->chunksize + lVar14));
    lVar14 = lVar14 + 8;
  } while (lVar14 != 0xa0);
  pfVar8 = local_40;
  fVar4 = fdb_commit((fdb_file_handle *)local_40,'\0');
  unaff_R13 = (code *)0x14;
  args = (fdb_kvs_config *)0xa0;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114295;
  unaff_R13 = (code *)&fconfig.num_blocks_readahead;
  args = local_438;
  uVar13 = 0;
  do {
    unaff_R15 = (fdb_config *)(dbstr + 0xf8);
    unaff_R12 = (fdb_config *)local_298;
    sprintf((char *)unaff_R12,"db%d",uVar13 & 0xffffffff);
    fdb_get_default_kvs_config();
    kvs_config.custom_cmp = local_78;
    auStack_68 = (undefined1  [8])__test_begin.tv_usec;
    kvs_config._0_8_ = tdb;
    pfVar6 = (fdb_config *)(bodybuf + uVar13 * 8 + 0xf8);
    in_RCX = (fdb_kvs_config *)auStack_68;
    pfVar8 = local_40;
    fVar4 = fdb_kvs_open((fdb_file_handle *)local_40,(fdb_kvs_handle **)pfVar6,(char *)unaff_R12,
                         in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114272;
    pfVar8 = *(fdb_kvs_handle **)pfVar6;
    fVar4 = fdb_get_kvs_seqnum(pfVar8,(fdb_seqnum_t *)&kvs_config.custom_cmp_param);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114277;
    if (kvs_config.custom_cmp_param != (void *)0x32) {
      multi_thread_kvs_client();
    }
    unaff_R12 = (fdb_config *)0x0;
    do {
      unaff_R15 = (fdb_config *)(dbstr + 0xf8);
      sprintf((char *)unaff_R15,"key%d",unaff_R12);
      sprintf((char *)unaff_R13,"meta%d",unaff_R12);
      sprintf((char *)args,"body%d",unaff_R12);
      sVar7 = strlen((char *)unaff_R15);
      in_RCX = (fdb_kvs_config *)0x0;
      fdb_doc_create((fdb_doc **)&dbfile,unaff_R15,sVar7,(void *)0x0,0,(void *)0x0,0);
      pfVar8 = *(fdb_kvs_handle **)pfVar6;
      fVar4 = fdb_get(pfVar8,(fdb_doc *)dbfile);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        multi_thread_kvs_client();
        goto LAB_00114263;
      }
      pvVar12 = *(void **)&dbfile->lock;
      sVar7 = strlen((char *)unaff_R15);
      iVar5 = bcmp(pvVar12,unaff_R15,sVar7);
      if (iVar5 != 0) {
        multi_thread_kvs_client();
      }
      iVar5 = bcmp(dbfile[1].cmp_func_list,unaff_R13,(size_t)dbfile->handles);
      if (iVar5 != 0) {
        multi_thread_kvs_client();
      }
      iVar5 = bcmp((void *)dbfile[1].flags,args,(size_t)dbfile->cmp_func_list);
      if (iVar5 != 0) {
        multi_thread_kvs_client();
      }
      fdb_doc_free((fdb_doc *)dbfile);
      uVar17 = (int)unaff_R12 + 1;
      unaff_R12 = (fdb_config *)(ulong)uVar17;
      unaff_R15 = (fdb_config *)(dbstr + 0xf8);
    } while (uVar17 != 0x32);
    pfVar8 = *(fdb_kvs_handle **)pfVar6;
    fVar4 = fdb_kvs_close(pfVar8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011427c;
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x14);
  fVar4 = fdb_close((fdb_file_handle *)local_40);
  pfVar6 = (fdb_config *)0x14;
  pfVar8 = local_40;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    fdb_shutdown();
    memleak_end();
    if (multi_thread_kvs_client(void*)::__test_pass == '\0') {
      pcVar25 = "%s PASSED\n";
    }
    else {
      pcVar25 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar25,"multi thread kvs client");
    return (void *)0x0;
  }
  goto LAB_0011429a;
LAB_0011468c:
  pfVar16[-2].max_writer_lock_prob = 0x114691;
  multi_thread_fhandle_share();
LAB_00114691:
  pfVar16[-2].max_writer_lock_prob = 0x114696;
  multi_thread_fhandle_share();
LAB_00114696:
  pfVar16[-2].max_writer_lock_prob = 0x11469b;
  multi_thread_fhandle_share();
LAB_0011469b:
  puVar9 = pfVar16[-2].encryption_key.bytes + 4;
  pcVar25 = "key%03d";
  pfVar16[-2].max_writer_lock_prob = 0x1146a0;
  multi_thread_fhandle_share();
  goto LAB_001146a0;
LAB_00114d80:
  pfVar16[-0xb].block_reusing_threshold = 0x114d85;
  custom_compare_primitive_test();
LAB_00114d85:
  pfVar16[-0xb].block_reusing_threshold = 0x114d8a;
  custom_compare_primitive_test();
LAB_00114d8a:
  pfVar16[-0xb].block_reusing_threshold = 0x114d8f;
  custom_compare_primitive_test();
  goto LAB_00114d8f;
LAB_00114263:
  pfVar16[-1].num_blocks_readahead = 0x114268;
  pfVar16[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar16[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
  pfVar26 = pfVar6;
LAB_00114268:
  pfVar16[-1].num_blocks_readahead = 0x11426d;
  pfVar16[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar16[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_0011426d:
  pfVar6 = pfVar26;
  pfVar16[-1].num_blocks_readahead = 0x114272;
  pfVar16[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar16[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_00114272:
  pfVar16[-1].num_blocks_readahead = 0x114277;
  pfVar16[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar16[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_00114277:
  pfVar16[-1].num_blocks_readahead = 0x11427c;
  pfVar16[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar16[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_0011427c:
  pfVar16[-1].num_blocks_readahead = 0x114281;
  pfVar16[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar16[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
  pfVar26 = pfVar16;
LAB_00114281:
  ppvVar15 = (void **)pfVar26;
  *(undefined8 *)((long)ppvVar15 + -8) = 0x114286;
  multi_thread_kvs_client();
LAB_00114286:
  *(undefined8 *)((long)ppvVar15 + -8) = 0x11428b;
  multi_thread_kvs_client();
  pfVar16 = (fdb_config *)ppvVar15;
LAB_0011428b:
  *(undefined8 *)((long)pfVar16 + -8) = 0x114290;
  multi_thread_kvs_client();
LAB_00114290:
  *(undefined8 *)((long)pfVar16 + -8) = 0x114295;
  multi_thread_kvs_client();
LAB_00114295:
  pfVar16[-1].num_blocks_readahead = 0x11429a;
  pfVar16[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar16[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_0011429a:
  *(code **)&pfVar16[-1].num_blocks_readahead = multi_thread_fhandle_share;
  multi_thread_kvs_client();
  *(undefined1 **)&pfVar16[-1].num_blocks_readahead = &stack0xfffffffffffffff8;
  *(fdb_config **)&pfVar16[-1].do_not_move_to_compacted_file = unaff_R15;
  pfVar16[-1].log_msg_level = (size_t)pfVar6;
  pfVar16[-1].breakpad_minidump_dir = (char *)unaff_R13;
  pfVar16[-1].num_keeping_headers = (size_t)unaff_R12;
  pfVar16[-1].max_block_reusing_cycle = (size_t)args;
  pfVar16[-2].max_writer_lock_prob = 0x1142bf;
  gettimeofday((timeval *)&pfVar16[-2].block_reusing_threshold,(__timezone_ptr_t)0x0);
  if (pfVar8 != (fdb_kvs_handle *)0x0) {
    if (*(char *)&pfVar8->op_stats == '\0') {
      if (((ulong)pfVar8->op_stats & 0x100) == 0) {
        puVar9 = pfVar16[-2].encryption_key.bytes + 4;
        unaff_R12 = (fdb_config *)&pfVar16[-2].max_block_reusing_cycle;
        unaff_R13 = (code *)&pfVar16[-2].enable_background_compactor;
        puVar18 = (uint64_t *)0x0;
        do {
          pfVar16[-2].max_block_reusing_cycle = 0;
          pfVar16[-2].max_writer_lock_prob = 0x1143ad;
          sprintf((char *)puVar9,"key%03d",puVar18);
          pfVar1 = (fdb_kvs_handle *)(pfVar8->kvs_config).custom_cmp_param;
          pfVar16[-2].max_writer_lock_prob = 0x1143c4;
          in_RCX = (fdb_kvs_config *)unaff_R12;
          fVar4 = fdb_get_kv(pfVar1,puVar9,7,(void **)unaff_R12,(size_t *)unaff_R13);
          if (fVar4 == FDB_RESULT_HANDLE_BUSY) {
            pfVar16[-2].max_writer_lock_prob = 0x114682;
            multi_thread_fhandle_share();
LAB_00114682:
            pfVar16[-2].max_writer_lock_prob = 0x114687;
            multi_thread_fhandle_share();
LAB_00114687:
            pfVar16[-2].max_writer_lock_prob = 0x11468c;
            multi_thread_fhandle_share();
            goto LAB_0011468c;
          }
          pfVar1 = (fdb_kvs_handle *)pfVar8->kvs;
          pfVar16[-2].max_writer_lock_prob = 0x1143e4;
          in_RCX = (fdb_kvs_config *)unaff_R12;
          fVar4 = fdb_get_kv(pfVar1,puVar9,7,(void **)unaff_R12,(size_t *)unaff_R13);
          if (fVar4 == FDB_RESULT_HANDLE_BUSY) goto LAB_00114682;
          pfVar1 = (fdb_kvs_handle *)(pfVar8->kvs_config).custom_cmp;
          pfVar16[-2].max_writer_lock_prob = 0x114404;
          in_RCX = (fdb_kvs_config *)unaff_R12;
          fVar4 = fdb_get_kv(pfVar1,puVar9,7,(void **)unaff_R12,(size_t *)unaff_R13);
          if (fVar4 == FDB_RESULT_HANDLE_BUSY) goto LAB_00114687;
          uVar17 = (int)puVar18 + 1;
          puVar18 = (uint64_t *)(ulong)uVar17;
        } while ((uVar17 != 2000) ||
                (puVar18 = (uint64_t *)0x0, ((ulong)pfVar8->op_stats & 0x100) == 0));
      }
    }
    else {
      puVar9 = pfVar16[-2].encryption_key.bytes + 4;
      puVar18 = (uint64_t *)0x0;
      do {
        pfVar16[-2].max_writer_lock_prob = 0x1142ef;
        sprintf((char *)puVar9,"key%03d",puVar18);
        pfVar1 = (fdb_kvs_handle *)(pfVar8->kvs_config).custom_cmp_param;
        in_RCX = (fdb_kvs_config *)0x0;
        pfVar16[-2].max_writer_lock_prob = 0x114305;
        fVar4 = fdb_set_kv(pfVar1,puVar9,7,(void *)0x0,0);
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011469b;
        pfVar1 = (fdb_kvs_handle *)pfVar8->kvs;
        in_RCX = (fdb_kvs_config *)0x0;
        pfVar16[-2].max_writer_lock_prob = 0x114323;
        fVar4 = fdb_set_kv(pfVar1,puVar9,7,(void *)0x0,0);
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114696;
        pfVar1 = (fdb_kvs_handle *)(pfVar8->kvs_config).custom_cmp;
        in_RCX = (fdb_kvs_config *)0x0;
        pfVar16[-2].max_writer_lock_prob = 0x114341;
        fVar4 = fdb_set_kv(pfVar1,puVar9,7,(void *)0x0,0);
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114691;
        pfVar2 = *(fdb_file_handle **)&pfVar8->kvs_config;
        pfVar16[-2].max_writer_lock_prob = 0x114356;
        fVar4 = fdb_commit(pfVar2,'\x01');
        if (fVar4 == FDB_RESULT_HANDLE_BUSY) goto LAB_0011468c;
        uVar17 = (int)puVar18 + 1;
        puVar18 = (uint64_t *)(ulong)uVar17;
      } while (uVar17 != 2000);
    }
    return (void *)0x0;
  }
  pfVar16[-2].max_writer_lock_prob = 0x11443a;
  pfVar8 = (fdb_kvs_handle *)malloc(0x10);
  pfVar16[-2].max_writer_lock_prob = 0x114447;
  pcVar25 = (char *)malloc(0x50);
  pfVar16[-2].max_writer_lock_prob = 0x114454;
  puVar9 = (uint8_t *)malloc(0x10);
  pfVar16[-2].max_writer_lock_prob = 0x114463;
  system("rm -rf  func_test* > errorlog.txt");
  unaff_R12 = (fdb_config *)&pfVar16[-2].max_block_reusing_cycle;
  pfVar16[-2].max_writer_lock_prob = 0x114470;
  fdb_get_default_config();
  pfVar16[-2].num_keeping_headers = 0;
  pfVar16[-2].field_0xf7 = 0;
  pfVar16[-1].prefetch_duration = 1;
  pfVar16[-2].max_writer_lock_prob = 0x114492;
  fdb_get_default_kvs_config();
  unaff_R13 = (code *)(pfVar16[-2].encryption_key.bytes + 4);
  pfVar16[-2].max_writer_lock_prob = 0x1144aa;
  sprintf((char *)unaff_R13,"./func_test_pt.%d",0);
  pfVar16[-2].max_writer_lock_prob = 0x1144b8;
  fVar4 = fdb_open((fdb_file_handle **)&pfVar16[-2].num_compactor_threads,(char *)unaff_R13,
                   unaff_R12);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar2 = (fdb_file_handle *)pfVar16[-2].num_compactor_threads;
    *(fdb_file_handle **)pcVar25 = pfVar2;
    *(fdb_file_handle **)(pcVar25 + 0x28) = pfVar2;
    pcVar25[0x20] = '\x01';
    pcVar25[0x48] = '\0';
    pfVar16[-2].max_writer_lock_prob = 0x1144e3;
    fVar4 = fdb_kvs_open_default
                      (pfVar2,(fdb_kvs_handle **)(pcVar25 + 0x30),
                       (fdb_kvs_config *)&pfVar16[-2].enable_background_compactor);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146a5;
    in_RCX = (fdb_kvs_config *)&pfVar16[-2].enable_background_compactor;
    pfVar16[-2].max_writer_lock_prob = 0x114504;
    fVar4 = fdb_kvs_open((fdb_file_handle *)pfVar16[-2].num_compactor_threads,
                         (fdb_kvs_handle **)(pcVar25 + 0x38),"main",in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146aa;
    in_RCX = (fdb_kvs_config *)&pfVar16[-2].enable_background_compactor;
    pfVar16[-2].max_writer_lock_prob = 0x114525;
    fVar4 = fdb_kvs_open((fdb_file_handle *)pfVar16[-2].num_compactor_threads,
                         (fdb_kvs_handle **)(pcVar25 + 0x40),"back",in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146af;
    pfVar16[-2].max_writer_lock_prob = 0x11453f;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfVar16[-2].num_compactor_threads,
                       (fdb_kvs_handle **)(pcVar25 + 8),
                       (fdb_kvs_config *)&pfVar16[-2].enable_background_compactor);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146b4;
    in_RCX = (fdb_kvs_config *)&pfVar16[-2].enable_background_compactor;
    pfVar16[-2].max_writer_lock_prob = 0x114560;
    fVar4 = fdb_kvs_open((fdb_file_handle *)pfVar16[-2].num_compactor_threads,
                         (fdb_kvs_handle **)(pcVar25 + 0x10),"main",in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146b9;
    in_RCX = (fdb_kvs_config *)&pfVar16[-2].enable_background_compactor;
    pfVar16[-2].max_writer_lock_prob = 0x114581;
    fVar4 = fdb_kvs_open((fdb_file_handle *)pfVar16[-2].num_compactor_threads,
                         (fdb_kvs_handle **)(pcVar25 + 0x18),"back",in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146be;
    pfVar16[-2].max_writer_lock_prob = 0x1145a1;
    printf("Creating %d writers+readers over %d docs..\n",1,2000);
    unaff_R12 = (fdb_config *)(pcVar25 + 0x28);
    lVar14 = 8;
    unaff_R13 = multi_thread_fhandle_share;
    do {
      LOCK();
      *(undefined1 *)((long)&((fdb_kvs_config *)((long)unaff_R12 + 0x18))->custom_cmp + 1) = 0;
      UNLOCK();
      pfVar16[-2].max_writer_lock_prob = 0x1145cc;
      in_RCX = (fdb_kvs_config *)unaff_R12;
      pthread_create((pthread_t *)(&(pfVar8->kvs_config).create_if_missing + lVar14),
                     (pthread_attr_t *)0x0,multi_thread_fhandle_share,unaff_R12);
      lVar14 = lVar14 + -8;
      unaff_R12 = (fdb_config *)&((fdb_kvs_config *)((long)unaff_R12 + -0x30))->custom_cmp;
    } while (lVar14 != -8);
    pfVar2 = *(fdb_file_handle **)&pfVar8->kvs_config;
    pfVar16[-2].max_writer_lock_prob = 0x1145e5;
    pthread_join((pthread_t)pfVar2,(void **)puVar9);
    pfVar16[-2].max_writer_lock_prob = 0x1145f5;
    printf("Writer %d done\n",0);
    LOCK();
    pcVar25[0x49] = '\x01';
    UNLOCK();
    __th = (pfVar8->kvs_config).custom_cmp;
    pfVar16[-2].max_writer_lock_prob = 0x11460b;
    pthread_join((pthread_t)__th,(void **)(puVar9 + 8));
    pfVar2 = *(fdb_file_handle **)pcVar25;
    pfVar16[-2].max_writer_lock_prob = 0x114613;
    fVar4 = fdb_close(pfVar2);
    puVar24 = (uint64_t *)0xfffffffffffffff8;
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfVar16[-2].max_writer_lock_prob = 0x114623;
      free(pfVar8);
      pfVar16[-2].max_writer_lock_prob = 0x11462b;
      free(pcVar25);
      pfVar16[-2].max_writer_lock_prob = 0x114633;
      free(puVar9);
      pfVar16[-2].max_writer_lock_prob = 0x114638;
      fdb_shutdown();
      pcVar25 = "%s PASSED\n";
      if (multi_thread_fhandle_share(void*)::__test_pass != '\0') {
        pcVar25 = "%s FAILED\n";
      }
      pfVar16[-2].max_writer_lock_prob = 0x114669;
      fprintf(_stderr,pcVar25,"multi thread file handle share test");
      return (void *)0x0;
    }
  }
  else {
LAB_001146a0:
    pfVar16[-2].max_writer_lock_prob = 0x1146a5;
    multi_thread_fhandle_share();
    puVar19 = puVar18;
LAB_001146a5:
    pfVar16[-2].max_writer_lock_prob = 0x1146aa;
    multi_thread_fhandle_share();
    puVar20 = puVar19;
LAB_001146aa:
    pfVar16[-2].max_writer_lock_prob = 0x1146af;
    multi_thread_fhandle_share();
    puVar21 = puVar20;
LAB_001146af:
    pfVar16[-2].max_writer_lock_prob = 0x1146b4;
    multi_thread_fhandle_share();
    puVar22 = puVar21;
LAB_001146b4:
    pfVar16[-2].max_writer_lock_prob = 0x1146b9;
    multi_thread_fhandle_share();
    puVar23 = puVar22;
LAB_001146b9:
    pfVar16[-2].max_writer_lock_prob = 0x1146be;
    multi_thread_fhandle_share();
    puVar24 = puVar23;
LAB_001146be:
    pfVar16[-2].max_writer_lock_prob = 0x1146c3;
    multi_thread_fhandle_share();
  }
  pfVar16[-2].max_writer_lock_prob = (size_t)incomplete_block_test;
  multi_thread_fhandle_share();
  pfVar16[-2].max_writer_lock_prob = (size_t)puVar24;
  pfVar16[-2].compaction_cb_ctx = puVar9;
  *(char **)&pfVar16[-2].compaction_cb_mask = pcVar25;
  pfVar16[-2].compaction_cb = unaff_R13;
  *(fdb_config **)&pfVar16[-2].num_wal_partitions = unaff_R12;
  pfVar16[-2].prefetch_duration = (uint64_t)pfVar8;
  pfVar16[-7].min_block_reuse_filesize = 0x1146e8;
  gettimeofday((timeval *)&pfVar16[-6].buffercache_size,(__timezone_ptr_t)0x0);
  pfVar16[-7].min_block_reuse_filesize = 0x1146ed;
  memleak_start();
  pfVar16[-7].breakpad_minidump_dir = (char *)0x0;
  pfVar16[-7].min_block_reuse_filesize = 0x1146fe;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar16[-7].min_block_reuse_filesize = 0x11470e;
  fdb_get_default_config();
  pfVar10 = (fdb_doc *)&pfVar16[-6].wal_flush_before_commit;
  pfVar16[-7].min_block_reuse_filesize = 0x11471b;
  fdb_get_default_kvs_config();
  pfVar16[-3].num_wal_partitions = 0;
  pfVar16[-3].num_bcache_partitions = 0;
  *(undefined4 *)&pfVar16[-3].field_0x54 = 0;
  pfVar16[-3].compaction_cb = (fdb_compaction_callback)0x400;
  *(undefined4 *)((long)&pfVar16[-3].compaction_cb_ctx + 4) = 1;
  *(undefined1 *)((long)&pfVar16[-3].max_writer_lock_prob + 7) = 0;
  pfVar6 = pfVar16 + -6;
  pfVar16[-7].min_block_reuse_filesize = 0x114749;
  fdb_open((fdb_file_handle **)pfVar6,"./dummy1",(fdb_config *)&pfVar16[-3].prefetch_duration);
  pfVar2 = *(fdb_file_handle **)pfVar6;
  ptr_handle = (char **)&pfVar16[-7].log_msg_level;
  pfVar16[-7].min_block_reuse_filesize = 0x11475c;
  fdb_kvs_open_default(pfVar2,(fdb_kvs_handle **)ptr_handle,(fdb_kvs_config *)pfVar10);
  pfVar16[-7].min_block_reuse_filesize = 0x114772;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)*ptr_handle,logCallbackFunc,"incomplete_block_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (fdb_config *)0x0;
    uVar13 = 0;
    do {
      pfVar16[-7].min_block_reuse_filesize = 0x11479a;
      sprintf(&pfVar16[-4].multi_kv_instances,"key%d",uVar13 & 0xffffffff);
      pfVar16[-7].min_block_reuse_filesize = 0x1147b2;
      sprintf((char *)&pfVar16[-5].compactor_sleep_duration,"meta%d",uVar13 & 0xffffffff);
      pfVar16[-7].min_block_reuse_filesize = 0x1147c7;
      sprintf((char *)&pfVar16[-6].compaction_minimum_filesize,"body%d",uVar13 & 0xffffffff);
      pfVar6 = (fdb_config *)((long)pfVar16 + (long)unaff_R12 + -0x5e0);
      pfVar16[-7].min_block_reuse_filesize = 0x1147d7;
      sVar7 = strlen(&pfVar16[-4].multi_kv_instances);
      puVar24 = &pfVar16[-5].compactor_sleep_duration;
      pfVar16[-7].min_block_reuse_filesize = 0x1147ea;
      pfVar10 = (fdb_doc *)strlen((char *)puVar24);
      pfVar16[-7].min_block_reuse_filesize = 0x1147f7;
      sVar11 = strlen((char *)&pfVar16[-6].compaction_minimum_filesize);
      pfVar16[-7].max_block_reusing_cycle = sVar11;
      pfVar16[-7].min_block_reuse_filesize = 0x114819;
      fdb_doc_create((fdb_doc **)pfVar6,&pfVar16[-4].multi_kv_instances,sVar7,puVar24,
                     (size_t)pfVar10,&pfVar16[-6].compaction_minimum_filesize,
                     pfVar16[-7].max_block_reusing_cycle);
      doc = *(fdb_doc **)((long)pfVar16 + uVar13 * 8 + -0x5e0);
      pfVar16[-7].min_block_reuse_filesize = 0x114828;
      fdb_set((fdb_kvs_handle *)pfVar16[-7].log_msg_level,doc);
      uVar13 = uVar13 + 1;
      unaff_R12 = (fdb_config *)((long)unaff_R12 + 8);
    } while (uVar13 == 1);
    unaff_R13 = (code *)0x0;
    ptr_handle = &pfVar16[-7].breakpad_minidump_dir;
    while( true ) {
      psVar3 = *(size_t **)((long)pfVar16 + (long)unaff_R13 * 8 + -0x5e0);
      keylen = *psVar3;
      pvVar12 = (void *)psVar3[4];
      pfVar16[-7].max_block_reusing_cycle = 0;
      in_RCX = (fdb_kvs_config *)0x0;
      pfVar16[-7].min_block_reuse_filesize = 0x114865;
      fdb_doc_create((fdb_doc **)ptr_handle,pvVar12,keylen,(void *)0x0,0,(void *)0x0,
                     pfVar16[-7].max_block_reusing_cycle);
      pfVar16[-7].min_block_reuse_filesize = 0x114874;
      fVar4 = fdb_get((fdb_kvs_handle *)pfVar16[-7].log_msg_level,
                      (fdb_doc *)pfVar16[-7].breakpad_minidump_dir);
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      pfVar10 = (fdb_doc *)pfVar16[-7].breakpad_minidump_dir;
      sVar7 = pfVar10->metalen;
      pfVar6 = (fdb_config *)pfVar10->meta;
      puVar24 = *(uint64_t **)((long)pfVar16 + (long)unaff_R13 * 8 + -0x5e0);
      unaff_R12 = (fdb_config *)puVar24[7];
      pfVar16[-7].min_block_reuse_filesize = 0x11489d;
      iVar5 = bcmp(pfVar6,unaff_R12,sVar7);
      if (iVar5 != 0) goto LAB_0011495d;
      sVar7 = pfVar10->bodylen;
      pfVar6 = (fdb_config *)pfVar10->body;
      unaff_R12 = (fdb_config *)puVar24[8];
      pfVar16[-7].min_block_reuse_filesize = 0x1148bc;
      iVar5 = bcmp(pfVar6,unaff_R12,sVar7);
      if (iVar5 != 0) goto LAB_00114968;
      pfVar16[-7].min_block_reuse_filesize = 0x1148cc;
      fdb_doc_free(pfVar10);
      pfVar16[-7].breakpad_minidump_dir = (char *)0x0;
      unaff_R13 = (code *)((bool *)unaff_R13 + 1);
      if (unaff_R13 != (code *)0x1) {
        pfVar16[-7].min_block_reuse_filesize = 0x1148ec;
        fdb_kvs_close((fdb_kvs_handle *)pfVar16[-7].log_msg_level);
        pfVar2 = *(fdb_file_handle **)(pfVar16 + -6);
        pfVar16[-7].min_block_reuse_filesize = 0x1148f6;
        fdb_close(pfVar2);
        lVar14 = 0;
        do {
          pfVar10 = *(fdb_doc **)((long)pfVar16 + lVar14 * 8 + -0x5e0);
          pfVar16[-7].min_block_reuse_filesize = 0x114902;
          fdb_doc_free(pfVar10);
          lVar14 = lVar14 + 1;
        } while (lVar14 == 1);
        pfVar16[-7].min_block_reuse_filesize = 0x114910;
        fdb_shutdown();
        pfVar16[-7].min_block_reuse_filesize = 0x114915;
        memleak_end();
        pcVar25 = "%s PASSED\n";
        if (incomplete_block_test()::__test_pass != '\0') {
          pcVar25 = "%s FAILED\n";
        }
        pfVar16[-7].min_block_reuse_filesize = 0x114946;
        iVar5 = fprintf(_stderr,pcVar25,"incomplete block test");
        return (void *)CONCAT44(extraout_var,iVar5);
      }
    }
    pfVar16[-7].min_block_reuse_filesize = 0x11495d;
    incomplete_block_test();
LAB_0011495d:
    pfVar16[-7].min_block_reuse_filesize = 0x114968;
    incomplete_block_test();
LAB_00114968:
    pfVar16[-7].min_block_reuse_filesize = 0x114973;
    incomplete_block_test();
  }
  pfVar16[-7].min_block_reuse_filesize = (uint64_t)custom_compare_primitive_test;
  incomplete_block_test();
  pfVar16[-7].min_block_reuse_filesize = (uint64_t)puVar24;
  pfVar16[-7].block_reusing_threshold = (size_t)pfVar6;
  *(fdb_doc **)(pfVar16[-7].encryption_key.bytes + 0x1c) = pfVar10;
  *(code **)(pfVar16[-7].encryption_key.bytes + 0x14) = unaff_R13;
  *(fdb_config **)(pfVar16[-7].encryption_key.bytes + 0xc) = unaff_R12;
  *(char ***)(pfVar16[-7].encryption_key.bytes + 4) = ptr_handle;
  uVar13 = 0;
  pfVar16[-0xb].block_reusing_threshold = 0x114997;
  gettimeofday((timeval *)(pfVar16 + -10),(__timezone_ptr_t)0x0);
  pfVar16[-0xb].block_reusing_threshold = 0x11499c;
  memleak_start();
  pfVar16[-0xb].num_keeping_headers = 0;
  pfVar16[-0xb].block_reusing_threshold = 0x1149ad;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar16[-0xb].block_reusing_threshold = 0x1149bd;
  fdb_get_default_config();
  pfVar16[-0xb].block_reusing_threshold = 0x1149ca;
  fdb_get_default_kvs_config();
  pfVar16[-9].encryption_key.algorithm = 0;
  pfVar16[-9].encryption_key.bytes[0] = '\0';
  pfVar16[-9].encryption_key.bytes[1] = '\0';
  pfVar16[-9].encryption_key.bytes[2] = '\0';
  pfVar16[-9].encryption_key.bytes[3] = '\0';
  pfVar6 = pfVar16 + -9;
  (pfVar6->encryption_key).bytes[4] = '\0';
  (pfVar6->encryption_key).bytes[5] = '\x04';
  (pfVar6->encryption_key).bytes[6] = '\0';
  (pfVar6->encryption_key).bytes[7] = '\0';
  (pfVar6->encryption_key).bytes[8] = '\0';
  (pfVar6->encryption_key).bytes[9] = '\0';
  (pfVar6->encryption_key).bytes[10] = '\0';
  (pfVar6->encryption_key).bytes[0xb] = '\0';
  pfVar6 = pfVar16 + -9;
  (pfVar6->encryption_key).bytes[0x18] = '\x01';
  (pfVar6->encryption_key).bytes[0x19] = '\0';
  (pfVar6->encryption_key).bytes[0x1a] = '\0';
  (pfVar6->encryption_key).bytes[0x1b] = '\0';
  pfVar16[-9].field_0xb7 = 0;
  *(undefined1 *)&pfVar16[-9].max_block_reusing_cycle = 1;
  *(code **)&pfVar16[-10].wal_flush_before_commit = _cmp_double;
  pfVar16[-0xb].block_reusing_threshold = 0x114a0a;
  fdb_open((fdb_file_handle **)&pfVar16[-0xb].num_blocks_readahead,"./dummy1",
           (fdb_config *)&pfVar16[-9].num_bgflusher_threads);
  pfVar16[-0xb].block_reusing_threshold = 0x114a1e;
  fdb_kvs_open_default
            (*(fdb_file_handle **)&pfVar16[-0xb].num_blocks_readahead,
             (fdb_kvs_handle **)&pfVar16[-0xb].do_not_move_to_compacted_file,
             (fdb_kvs_config *)&pfVar16[-10].wal_threshold);
  pfVar8 = *(fdb_kvs_handle **)&pfVar16[-0xb].do_not_move_to_compacted_file;
  __src = logCallbackFunc;
  pfVar16[-0xb].block_reusing_threshold = 0x114a34;
  fVar4 = fdb_set_log_callback(pfVar8,logCallbackFunc,"custom_compare_primitive_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    puVar24 = (uint64_t *)&pfVar16[-10].compaction_buf_maxsize;
    psVar3 = &pfVar16[-8].num_bgflusher_threads;
    lVar14 = 0;
    do {
      dVar29 = 10000.0 / (double)(int)lVar14;
      pfVar16[-10].num_compactor_threads = (size_t)dVar29;
      pfVar16[-0xb].max_block_reusing_cycle = (size_t)dVar29;
      pfVar16[-0xb].block_reusing_threshold = 0x114a8f;
      sprintf((char *)psVar3,"value: %d, %f",SUB84(dVar29,0),uVar13);
      pfVar16[-0xb].block_reusing_threshold = 0x114a97;
      sVar7 = strlen((char *)psVar3);
      pfVar16[-0xb].min_block_reuse_filesize = sVar7 + 1;
      pfVar16[-0xb].block_reusing_threshold = 0x114ab6;
      fdb_doc_create((fdb_doc **)puVar24,&pfVar16[-10].num_compactor_threads,8,(void *)0x0,0,psVar3,
                     pfVar16[-0xb].min_block_reuse_filesize);
      pfVar10 = (fdb_doc *)*puVar24;
      pfVar16[-0xb].block_reusing_threshold = 0x114ac3;
      fdb_set(*(fdb_kvs_handle **)&pfVar16[-0xb].do_not_move_to_compacted_file,pfVar10);
      lVar14 = lVar14 + 0xb;
      uVar13 = (ulong)((int)uVar13 + 1);
      puVar24 = puVar24 + 1;
    } while (lVar14 != 0x6e);
    psVar3 = &pfVar16[-0xb].log_msg_level;
    *psVar3 = pfVar16[-0xb].max_block_reusing_cycle;
    *(undefined4 *)&pfVar16[-0xb].min_block_reuse_filesize = 0;
    in_RCX = (fdb_kvs_config *)0x0;
    pfVar16[-0xb].block_reusing_threshold = 0x114b02;
    fdb_iterator_init(*(fdb_kvs_handle **)&pfVar16[-0xb].do_not_move_to_compacted_file,
                      (fdb_iterator **)&pfVar16[-0xb].breakpad_minidump_dir,(void *)0x0,0,
                      (void *)0x0,0,(fdb_iterator_opt_t)pfVar16[-0xb].min_block_reuse_filesize);
    uVar27 = 0;
    uVar28 = 0xbff00000;
    do {
      pfVar16[-0xb].max_block_reusing_cycle = CONCAT44(uVar28,uVar27);
      pfVar8 = (fdb_kvs_handle *)pfVar16[-0xb].breakpad_minidump_dir;
      pfVar16[-0xb].block_reusing_threshold = 0x114b22;
      __src = (code *)&pfVar16[-0xb].num_keeping_headers;
      fVar4 = fdb_iterator_get((fdb_iterator *)pfVar8,(fdb_doc **)&pfVar16[-0xb].num_keeping_headers
                              );
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00114d7b:
        pfVar16[-0xb].block_reusing_threshold = 0x114d80;
        custom_compare_primitive_test();
        goto LAB_00114d80;
      }
      sVar7 = *(size_t *)pfVar16[-0xb].num_keeping_headers;
      __src = (code *)((size_t *)pfVar16[-0xb].num_keeping_headers)[4];
      pfVar16[-0xb].block_reusing_threshold = 0x114b3e;
      pfVar8 = (fdb_kvs_handle *)psVar3;
      memcpy(psVar3,__src,sVar7);
      dVar29 = (double)pfVar16[-0xb].log_msg_level;
      if (dVar29 < (double)pfVar16[-0xb].max_block_reusing_cycle ||
          dVar29 == (double)pfVar16[-0xb].max_block_reusing_cycle) {
        pfVar16[-0xb].block_reusing_threshold = 0x114d7b;
        custom_compare_primitive_test();
        goto LAB_00114d7b;
      }
      pfVar16[-0xb].max_block_reusing_cycle = (size_t)dVar29;
      pfVar16[-0xb].block_reusing_threshold = 0x114b60;
      fdb_doc_free((fdb_doc *)pfVar16[-0xb].num_keeping_headers);
      pfVar16[-0xb].num_keeping_headers = 0;
      pfVar16[-0xb].block_reusing_threshold = 0x114b73;
      fVar4 = fdb_iterator_next((fdb_iterator *)pfVar16[-0xb].breakpad_minidump_dir);
      uVar27 = (undefined4)pfVar16[-0xb].max_block_reusing_cycle;
      uVar28 = (undefined4)(pfVar16[-0xb].max_block_reusing_cycle >> 0x20);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    pfVar16[-0xb].block_reusing_threshold = 0x114b8b;
    fdb_iterator_close((fdb_iterator *)pfVar16[-0xb].breakpad_minidump_dir);
    pfVar16[-0xb].block_reusing_threshold = 0x114b9a;
    fdb_commit(*(fdb_file_handle **)&pfVar16[-0xb].num_blocks_readahead,'\x01');
    *(undefined4 *)&pfVar16[-0xb].min_block_reuse_filesize = 0;
    in_RCX = (fdb_kvs_config *)0x0;
    pfVar16[-0xb].block_reusing_threshold = 0x114bb8;
    fdb_iterator_init(*(fdb_kvs_handle **)&pfVar16[-0xb].do_not_move_to_compacted_file,
                      (fdb_iterator **)&pfVar16[-0xb].breakpad_minidump_dir,(void *)0x0,0,
                      (void *)0x0,0,(fdb_iterator_opt_t)pfVar16[-0xb].min_block_reuse_filesize);
    uVar27 = 0;
    uVar28 = 0xbff00000;
    do {
      pfVar16[-0xb].max_block_reusing_cycle = CONCAT44(uVar28,uVar27);
      pfVar8 = (fdb_kvs_handle *)pfVar16[-0xb].breakpad_minidump_dir;
      pfVar16[-0xb].block_reusing_threshold = 0x114bdd;
      __src = (code *)&pfVar16[-0xb].num_keeping_headers;
      fVar4 = fdb_iterator_get((fdb_iterator *)pfVar8,(fdb_doc **)&pfVar16[-0xb].num_keeping_headers
                              );
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114d85;
      sVar7 = *(size_t *)pfVar16[-0xb].num_keeping_headers;
      __src = (code *)((size_t *)pfVar16[-0xb].num_keeping_headers)[4];
      pfVar16[-0xb].block_reusing_threshold = 0x114bf9;
      pfVar8 = (fdb_kvs_handle *)&pfVar16[-0xb].log_msg_level;
      memcpy(&pfVar16[-0xb].log_msg_level,__src,sVar7);
      dVar29 = (double)pfVar16[-0xb].log_msg_level;
      if (dVar29 < (double)pfVar16[-0xb].max_block_reusing_cycle ||
          dVar29 == (double)pfVar16[-0xb].max_block_reusing_cycle) goto LAB_00114d80;
      pfVar16[-0xb].max_block_reusing_cycle = (size_t)dVar29;
      pfVar16[-0xb].block_reusing_threshold = 0x114c1b;
      fdb_doc_free((fdb_doc *)pfVar16[-0xb].num_keeping_headers);
      pfVar16[-0xb].num_keeping_headers = 0;
      pfVar16[-0xb].block_reusing_threshold = 0x114c2e;
      fVar4 = fdb_iterator_next((fdb_iterator *)pfVar16[-0xb].breakpad_minidump_dir);
      uVar27 = (undefined4)pfVar16[-0xb].max_block_reusing_cycle;
      uVar28 = (undefined4)(pfVar16[-0xb].max_block_reusing_cycle >> 0x20);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    pfVar16[-0xb].block_reusing_threshold = 0x114c46;
    fdb_iterator_close((fdb_iterator *)pfVar16[-0xb].breakpad_minidump_dir);
    pfVar16[-0xb].block_reusing_threshold = 0x114c57;
    fdb_compact(*(fdb_file_handle **)&pfVar16[-0xb].num_blocks_readahead,"./dummy2");
    *(undefined4 *)&pfVar16[-0xb].min_block_reuse_filesize = 0;
    in_RCX = (fdb_kvs_config *)0x0;
    pfVar16[-0xb].block_reusing_threshold = 0x114c75;
    fdb_iterator_init(*(fdb_kvs_handle **)&pfVar16[-0xb].do_not_move_to_compacted_file,
                      (fdb_iterator **)&pfVar16[-0xb].breakpad_minidump_dir,(void *)0x0,0,
                      (void *)0x0,0,(fdb_iterator_opt_t)pfVar16[-0xb].min_block_reuse_filesize);
    uVar27 = 0;
    uVar28 = 0xbff00000;
    while( true ) {
      pfVar16[-0xb].max_block_reusing_cycle = CONCAT44(uVar28,uVar27);
      pfVar8 = (fdb_kvs_handle *)pfVar16[-0xb].breakpad_minidump_dir;
      pfVar16[-0xb].block_reusing_threshold = 0x114c9a;
      __src = (code *)&pfVar16[-0xb].num_keeping_headers;
      fVar4 = fdb_iterator_get((fdb_iterator *)pfVar8,(fdb_doc **)&pfVar16[-0xb].num_keeping_headers
                              );
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      sVar7 = *(size_t *)pfVar16[-0xb].num_keeping_headers;
      __src = (code *)((size_t *)pfVar16[-0xb].num_keeping_headers)[4];
      pfVar16[-0xb].block_reusing_threshold = 0x114cb6;
      pfVar8 = (fdb_kvs_handle *)&pfVar16[-0xb].log_msg_level;
      memcpy(&pfVar16[-0xb].log_msg_level,__src,sVar7);
      dVar29 = (double)pfVar16[-0xb].log_msg_level;
      if (dVar29 < (double)pfVar16[-0xb].max_block_reusing_cycle ||
          dVar29 == (double)pfVar16[-0xb].max_block_reusing_cycle) goto LAB_00114d8a;
      pfVar16[-0xb].max_block_reusing_cycle = (size_t)dVar29;
      pfVar16[-0xb].block_reusing_threshold = 0x114cd8;
      fdb_doc_free((fdb_doc *)pfVar16[-0xb].num_keeping_headers);
      pfVar16[-0xb].num_keeping_headers = 0;
      pfVar16[-0xb].block_reusing_threshold = 0x114ceb;
      fVar4 = fdb_iterator_next((fdb_iterator *)pfVar16[-0xb].breakpad_minidump_dir);
      uVar27 = (undefined4)pfVar16[-0xb].max_block_reusing_cycle;
      uVar28 = (undefined4)(pfVar16[-0xb].max_block_reusing_cycle >> 0x20);
      if (fVar4 == FDB_RESULT_ITERATOR_FAIL) {
        pfVar16[-0xb].block_reusing_threshold = 0x114d00;
        fdb_iterator_close((fdb_iterator *)pfVar16[-0xb].breakpad_minidump_dir);
        pfVar16[-0xb].block_reusing_threshold = 0x114d0a;
        fdb_kvs_close(*(fdb_kvs_handle **)&pfVar16[-0xb].do_not_move_to_compacted_file);
        pfVar16[-0xb].block_reusing_threshold = 0x114d14;
        fdb_close(*(fdb_file_handle **)&pfVar16[-0xb].num_blocks_readahead);
        lVar14 = 0;
        do {
          pfVar10 = *(fdb_doc **)((long)pfVar16 + lVar14 * 8 + -0x988);
          pfVar16[-0xb].block_reusing_threshold = 0x114d20;
          fdb_doc_free(pfVar10);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 10);
        pfVar16[-0xb].block_reusing_threshold = 0x114d2e;
        fdb_shutdown();
        pfVar16[-0xb].block_reusing_threshold = 0x114d33;
        memleak_end();
        pcVar25 = "%s PASSED\n";
        if (custom_compare_primitive_test()::__test_pass != '\0') {
          pcVar25 = "%s FAILED\n";
        }
        pfVar16[-0xb].block_reusing_threshold = 0x114d64;
        iVar5 = fprintf(_stderr,pcVar25,"custom compare function for primitive key test");
        return (void *)CONCAT44(extraout_var_00,iVar5);
      }
    }
LAB_00114d8f:
    pfVar16[-0xb].block_reusing_threshold = 0x114d94;
    custom_compare_primitive_test();
  }
  pfVar16[-0xb].block_reusing_threshold = (size_t)_cmp_double;
  custom_compare_primitive_test();
  pvVar12 = (void *)0xffffffff;
  if (__src != (code *)0x0) {
    if (in_RCX == (fdb_kvs_config *)0x0) {
      return (void *)0x1;
    }
    if (*extraout_RDX <= *(double *)&pfVar8->kvs_config) {
      pvVar12 = (void *)(ulong)(*extraout_RDX < *(double *)&pfVar8->kvs_config);
    }
  }
  return pvVar12;
}

Assistant:

void *multi_thread_kvs_client(void *args)
{

    TEST_INIT();

    int i, j, r;
    int n = 50;
    int nclients = 20;
    int *tid_args = alca(int, nclients);
    char dbstr[256];
    char keybuf[256], metabuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *tdb;
    fdb_kvs_handle **db = alca(fdb_kvs_handle*, nclients);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    fdb_seqnum_t seqnum;
    thread_t *tid;
    void **thread_ret;

    if (args == NULL)
    { // parent
        memleak_start();

        r = system(SHELL_DEL" dummy* > errorlog.txt");
        (void)r;

        // init dbfile
        fconfig = fdb_get_default_config();
        fconfig.buffercache_size = 0;
        fconfig.wal_threshold = 1024;
        fconfig.compaction_threshold = 0;

        status = fdb_open(&dbfile, "./dummy1", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        tid = alca(thread_t, nclients);
        thread_ret = alca(void *, nclients);
        for (i=0;i<nclients;++i){
            sprintf(dbstr, "db%d", i);
            kvs_config = fdb_get_default_kvs_config();
            status = fdb_kvs_open(dbfile, &db[i], dbstr, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_kvs_close(db[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        for (i=0;i<nclients;++i){
            tid_args[i] = i;
            thread_create(&tid[i], multi_thread_kvs_client,
                          (void *)&tid_args[i]);
        }
        for (i=0;i<nclients;++i){
            thread_join(tid[i], &thread_ret[i]);
        }

        status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // check threads updated kvs
        for (i=0; i<nclients; i++){
            sprintf(dbstr, "db%d", i);
            kvs_config = fdb_get_default_kvs_config();
            status = fdb_kvs_open(dbfile, &db[i], dbstr, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);

            // verify seqnum
            status = fdb_get_kvs_seqnum(db[i], &seqnum);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CHK(seqnum == (fdb_seqnum_t)n);

            for (j=0; j<n; j++){
                sprintf(keybuf, "key%d", j);
                sprintf(metabuf, "meta%d", j);
                sprintf(bodybuf, "body%d", j);
                fdb_doc_create(&rdoc, keybuf, strlen(keybuf),
                                      NULL, 0, NULL, 0);
                status = fdb_get(db[i], rdoc);
                TEST_CHK(status == FDB_RESULT_SUCCESS);
                TEST_CHK(!memcmp(rdoc->key, keybuf, strlen(keybuf)));
                TEST_CHK(!memcmp(rdoc->meta, metabuf, rdoc->metalen));
                TEST_CHK(!memcmp(rdoc->body, bodybuf, rdoc->bodylen));
                fdb_doc_free(rdoc);
            }
            status = fdb_kvs_close(db[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }

        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_shutdown();
        memleak_end();
        TEST_RESULT("multi thread kvs client");
        return NULL;
    }

    // threads enter here //

    // open fhandle
    fconfig = fdb_get_default_config();
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // get kvs ID from args
    memcpy(&i, args, sizeof(int));
    sprintf(dbstr, "db%d", i);
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open(dbfile, &tdb, dbstr, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(tdb, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc[i]);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    return NULL;
}